

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::FastEntityStatePdu::marshal(FastEntityStatePdu *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pAVar2;
  ulong uVar3;
  long lVar4;
  ArticulationParameter x;
  ArticulationParameter local_48;
  
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  DataStream::operator<<
            (dataStream,
             *(unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x14);
  DataStream::operator<<
            (dataStream,
             *(unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x16);
  DataStream::operator<<(dataStream,this->_entity);
  DataStream::operator<<(dataStream,this->_forceId);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_articulationParameters).
                                    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_articulationParameters).
                                   super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  DataStream::operator<<(dataStream,this->_entityKind);
  DataStream::operator<<(dataStream,this->_domain);
  DataStream::operator<<(dataStream,this->_country);
  DataStream::operator<<(dataStream,this->_category);
  DataStream::operator<<(dataStream,this->_subcategory);
  DataStream::operator<<(dataStream,this->_specific);
  DataStream::operator<<(dataStream,this->_extra);
  DataStream::operator<<(dataStream,this->_altEntityKind);
  DataStream::operator<<(dataStream,this->_altDomain);
  DataStream::operator<<(dataStream,this->_altCountry);
  DataStream::operator<<(dataStream,this->_altCategory);
  DataStream::operator<<(dataStream,this->_altSubcategory);
  DataStream::operator<<(dataStream,this->_altSpecific);
  DataStream::operator<<(dataStream,this->_altExtra);
  DataStream::operator<<(dataStream,this->_xVelocity);
  DataStream::operator<<(dataStream,this->_yVelocity);
  DataStream::operator<<(dataStream,this->_zVelocity);
  DataStream::operator<<(dataStream,this->_xLocation);
  DataStream::operator<<(dataStream,this->_yLocation);
  DataStream::operator<<(dataStream,this->_zLocation);
  DataStream::operator<<(dataStream,this->_psi);
  DataStream::operator<<(dataStream,this->_theta);
  DataStream::operator<<(dataStream,this->_phi);
  DataStream::operator<<(dataStream,this->_entityAppearance);
  DataStream::operator<<(dataStream,this->_deadReckoningAlgorithm);
  lVar4 = -0xf;
  do {
    DataStream::operator<<(dataStream,this->_otherParameters[lVar4 + 0xf]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  DataStream::operator<<(dataStream,this->_xAcceleration);
  DataStream::operator<<(dataStream,this->_yAcceleration);
  DataStream::operator<<(dataStream,this->_zAcceleration);
  DataStream::operator<<(dataStream,this->_xAngularVelocity);
  DataStream::operator<<(dataStream,this->_yAngularVelocity);
  DataStream::operator<<(dataStream,this->_zAngularVelocity);
  lVar4 = -0xc;
  do {
    DataStream::operator<<(dataStream,this->_marking[lVar4 + 0xc]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  DataStream::operator<<(dataStream,this->_capabilities);
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_articulationParameters).
      super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar2) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      local_48._vptr_ArticulationParameter = (_func_int **)&PTR__ArticulationParameter_0019f588;
      puVar1 = (undefined8 *)((long)&pAVar2->_vptr_ArticulationParameter + lVar4);
      local_48._8_8_ = *puVar1;
      local_48._parameterValue = (double)puVar1[1];
      ArticulationParameter::marshal(&local_48,dataStream);
      ArticulationParameter::~ArticulationParameter(&local_48);
      uVar3 = uVar3 + 1;
      pAVar2 = (this->_articulationParameters).
               super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    } while (uVar3 < (ulong)(((long)(this->_articulationParameters).
                                    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void FastEntityStatePdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _site;
    dataStream << _application;
    dataStream << _entity;
    dataStream << _forceId;
    dataStream << ( char )_articulationParameters.size();
    dataStream << _entityKind;
    dataStream << _domain;
    dataStream << _country;
    dataStream << _category;
    dataStream << _subcategory;
    dataStream << _specific;
    dataStream << _extra;
    dataStream << _altEntityKind;
    dataStream << _altDomain;
    dataStream << _altCountry;
    dataStream << _altCategory;
    dataStream << _altSubcategory;
    dataStream << _altSpecific;
    dataStream << _altExtra;
    dataStream << _xVelocity;
    dataStream << _yVelocity;
    dataStream << _zVelocity;
    dataStream << _xLocation;
    dataStream << _yLocation;
    dataStream << _zLocation;
    dataStream << _psi;
    dataStream << _theta;
    dataStream << _phi;
    dataStream << _entityAppearance;
    dataStream << _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream << _otherParameters[idx];
     }

    dataStream << _xAcceleration;
    dataStream << _yAcceleration;
    dataStream << _zAcceleration;
    dataStream << _xAngularVelocity;
    dataStream << _yAngularVelocity;
    dataStream << _zAngularVelocity;

     for(size_t idx = 0; idx < 12; idx++)
     {
        dataStream << _marking[idx];
     }

    dataStream << _capabilities;

     for(size_t idx = 0; idx < _articulationParameters.size(); idx++)
     {
        ArticulationParameter x = _articulationParameters[idx];
        x.marshal(dataStream);
     }

}